

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::RelaxFloatOpsPass::IsFloat32(RelaxFloatOpsPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t id;
  size_type sVar2;
  DefUseManager *this_00;
  Instruction *this_01;
  Instruction *opnd_inst;
  Op local_28;
  uint32_t opnd_id;
  Instruction *pIStack_20;
  uint32_t ty_id;
  Instruction *inst_local;
  RelaxFloatOpsPass *this_local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)this;
  local_28 = opt::Instruction::opcode(inst);
  sVar2 = std::
          unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
          ::count(&this->target_ops_core_f_opnd_,&local_28);
  if (sVar2 == 0) {
    opnd_id = opt::Instruction::type_id(pIStack_20);
    if (opnd_id == 0) {
      return false;
    }
  }
  else {
    id = opt::Instruction::GetSingleWordInOperand(pIStack_20,0);
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    this_01 = analysis::DefUseManager::GetDef(this_00,id);
    opnd_id = opt::Instruction::type_id(this_01);
  }
  bVar1 = Pass::IsFloat(&this->super_Pass,opnd_id,0x20);
  return bVar1;
}

Assistant:

bool RelaxFloatOpsPass::IsFloat32(Instruction* inst) {
  uint32_t ty_id;
  if (target_ops_core_f_opnd_.count(inst->opcode()) != 0) {
    uint32_t opnd_id = inst->GetSingleWordInOperand(0);
    Instruction* opnd_inst = get_def_use_mgr()->GetDef(opnd_id);
    ty_id = opnd_inst->type_id();
  } else {
    ty_id = inst->type_id();
    if (ty_id == 0) return false;
  }
  return IsFloat(ty_id, 32);
}